

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedBlending.cpp
# Opt level: O0

bool __thiscall
glcts::DrawBuffersIndexedBlending::VerifyImg
          (DrawBuffersIndexedBlending *this,TextureLevel *textureLevel,RGBA expectedColor,
          RGBA epsilon)

{
  undefined4 uVar1;
  RGBA RVar2;
  bool bVar3;
  int iVar4;
  TestLog *this_00;
  MessageBuilder *pMVar5;
  MessageBuilder local_200;
  deUint32 local_7c;
  deUint32 local_78;
  deUint32 local_74;
  ConstPixelBufferAccess local_70;
  undefined1 local_44 [24];
  RGBA pixel;
  int x;
  int y;
  TextureLevel *textureLevel_local;
  DrawBuffersIndexedBlending *this_local;
  RGBA local_10;
  RGBA epsilon_local;
  RGBA expectedColor_local;
  
  pixel.m_value = 0;
  this_local._4_4_ = epsilon.m_value;
  local_10.m_value = expectedColor.m_value;
  do {
    RVar2.m_value = pixel.m_value;
    iVar4 = tcu::TextureLevel::getHeight(textureLevel);
    if (iVar4 <= (int)RVar2.m_value) {
      return true;
    }
    for (local_44._20_4_ = 0; uVar1 = local_44._20_4_,
        iVar4 = tcu::TextureLevel::getWidth(textureLevel), (int)uVar1 < iVar4;
        local_44._20_4_ = local_44._20_4_ + 1) {
      tcu::TextureLevel::getAccess(&local_70,textureLevel);
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)local_44,(int)&local_70,local_44._20_4_,pixel.m_value);
      tcu::RGBA::RGBA((RGBA *)(local_44 + 0x10),(Vec4 *)local_44);
      local_74 = local_44._16_4_;
      local_78 = local_10.m_value;
      local_7c = this_local._4_4_;
      bVar3 = tcu::compareThreshold((RGBA)local_44._16_4_,local_10,this_local._4_4_);
      if (!bVar3) {
        this_00 = tcu::TestContext::getLog
                            ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                             super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_200,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<(&local_200,(char (*) [17])0x2ad0d0c);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_10);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b8f97b);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [17])"Read value:     ");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(RGBA *)(local_44 + 0x10));
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b8f97b);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [17])"Epsilon:        ");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(RGBA *)((long)&this_local + 4));
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_200);
        return false;
      }
    }
    pixel.m_value = pixel.m_value + 1;
  } while( true );
}

Assistant:

bool DrawBuffersIndexedBlending::VerifyImg(const tcu::TextureLevel& textureLevel, tcu::RGBA expectedColor,
										   tcu::RGBA epsilon)
{
	for (int y = 0; y < textureLevel.getHeight(); ++y)
	{
		for (int x = 0; x < textureLevel.getWidth(); ++x)
		{
			tcu::RGBA pixel(textureLevel.getAccess().getPixel(x, y));
			if (!tcu::compareThreshold(pixel, expectedColor, epsilon))
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Expected value: " << expectedColor << "\n"
								   << "Read value:     " << pixel << "\n"
								   << "Epsilon:        " << epsilon << tcu::TestLog::EndMessage;
				return false;
			}
		}
	}
	return true;
}